

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

ctl_arena_t * arenas_i_impl(tsd_t *tsd,size_t i,_Bool compat,_Bool init)

{
  uint uVar1;
  base_t *base;
  ctl_arena_t *pcVar2;
  ulong uVar3;
  
  uVar1 = (uint)i;
  if (i == 0x1000) {
LAB_0115c198:
    uVar3 = 0;
  }
  else if (i == 0x1001) {
    uVar3 = 1;
  }
  else {
    if ((compat) && (ctl_arenas->narenas == i)) goto LAB_0115c198;
    uVar3 = (ulong)(uVar1 + 2);
  }
  pcVar2 = ctl_arenas->duckdb_je_arenas[uVar3];
  if (!init) {
    return pcVar2;
  }
  if (pcVar2 != (ctl_arena_t *)0x0) {
    return pcVar2;
  }
  base = duckdb_je_b0get();
  pcVar2 = (ctl_arena_t *)duckdb_je_base_alloc((tsdn_t *)tsd,base,0x9870,0x10);
  if (pcVar2 == (ctl_arena_t *)0x0) {
    return (ctl_arena_t *)0x0;
  }
  pcVar2->astats = (ctl_arena_stats_t *)(pcVar2 + 1);
  pcVar2->arena_ind = uVar1;
  if (i != 0x1000) {
    if (i == 0x1001) {
      uVar3 = 1;
      goto LAB_0115c211;
    }
    if ((!compat) || (ctl_arenas->narenas != i)) {
      uVar3 = (ulong)(uVar1 + 2);
      goto LAB_0115c211;
    }
  }
  uVar3 = 0;
LAB_0115c211:
  ctl_arenas->duckdb_je_arenas[uVar3] = pcVar2;
  return pcVar2;
}

Assistant:

static ctl_arena_t *
arenas_i_impl(tsd_t *tsd, size_t i, bool compat, bool init) {
	ctl_arena_t *ret;

	assert(!compat || !init);

	ret = ctl_arenas->arenas[arenas_i2a_impl(i, compat, false)];
	if (init && ret == NULL) {
		if (config_stats) {
			struct container_s {
				ctl_arena_t		ctl_arena;
				ctl_arena_stats_t	astats;
			};
			struct container_s *cont =
			    (struct container_s *)base_alloc(tsd_tsdn(tsd),
			    b0get(), sizeof(struct container_s), QUANTUM);
			if (cont == NULL) {
				return NULL;
			}
			ret = &cont->ctl_arena;
			ret->astats = &cont->astats;
		} else {
			ret = (ctl_arena_t *)base_alloc(tsd_tsdn(tsd), b0get(),
			    sizeof(ctl_arena_t), QUANTUM);
			if (ret == NULL) {
				return NULL;
			}
		}
		ret->arena_ind = (unsigned)i;
		ctl_arenas->arenas[arenas_i2a_impl(i, compat, false)] = ret;
	}

	assert(ret == NULL || arenas_i2a(ret->arena_ind) == arenas_i2a(i));
	return ret;
}